

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_components.c
# Opt level: O1

void key_components_free(key_components *kc)

{
  uint uVar1;
  key_component *pkVar2;
  long lVar3;
  ulong uVar4;
  
  if (kc->ncomponents != 0) {
    lVar3 = 0x10;
    uVar4 = 0;
    do {
      pkVar2 = kc->components;
      safefree(*(void **)((long)pkVar2 + lVar3 + -0x10));
      uVar1 = *(uint *)((long)pkVar2 + lVar3 + -8);
      if (uVar1 < 2) {
        strbuf_free(*(strbuf **)((long)&pkVar2->name + lVar3));
      }
      else {
        if (uVar1 != 2) {
          __assert_fail("false && \"bad key component type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/key_components.c"
                        ,0x58,"void key_components_free(key_components *)");
        }
        mp_free(*(mp_int **)((long)&pkVar2->name + lVar3));
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 < kc->ncomponents);
  }
  safefree(kc->components);
  safefree(kc);
  return;
}

Assistant:

void key_components_free(key_components *kc)
{
    for (size_t i = 0; i < kc->ncomponents; i++) {
        key_component *comp = &kc->components[i];
        sfree(comp->name);
        switch (comp->type) {
          case KCT_MPINT:
            mp_free(comp->mp);
            break;
          case KCT_TEXT:
          case KCT_BINARY:
            strbuf_free(comp->str);
            break;
          default:
            unreachable("bad key component type");
        }
    }
    sfree(kc->components);
    sfree(kc);
}